

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall embree::TutorialApplication::~TutorialApplication(TutorialApplication *this)

{
  unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_> *in_RDI;
  void *in_stack_ffffffffffffffd8;
  unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_> *in_stack_ffffffffffffffe0;
  Application *this_00;
  unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_> *this_01;
  
  (in_RDI->_M_t).super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>.
  _M_t.super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
  super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl =
       (ISPCScene *)&PTR__TutorialApplication_006038c8;
  g_ispc_scene = (ISPCScene *)0x0;
  this_01 = in_RDI;
  std::unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  device_cleanup();
  if (g_device != (RTCDevice)0x0) {
    rtcReleaseDevice(g_device);
  }
  alignedUSMFree((void *)0x13b8fa);
  in_RDI[0x25]._M_t.
  super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
  super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
  super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl = (ISPCScene *)0x0;
  *(undefined4 *)
   &in_RDI[0x24]._M_t.
    super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
    super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
    super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl = 0;
  *(undefined4 *)
   ((long)&in_RDI[0x24]._M_t.
           super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
           super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
           super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl + 4) = 0;
  alignedFree(in_stack_ffffffffffffffd8);
  g_stats = (RayStats *)0x0;
  std::unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>::~unique_ptr(this_01);
  Averaged<double>::~Averaged((Averaged<double> *)0x13b95b);
  Averaged<double>::~Averaged((Averaged<double> *)0x13b96c);
  Averaged<double>::~Averaged((Averaged<double> *)0x13b97d);
  embree::FileName::~FileName((FileName *)0x13b98e);
  embree::FileName::~FileName((FileName *)0x13b99f);
  this_00 = (Application *)(in_RDI + 0x1a);
  if (this_00->_vptr_Application != (_func_int **)0x0) {
    (**(code **)(*this_00->_vptr_Application + 0x18))();
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x16));
  Application::~Application(this_00);
  return;
}

Assistant:

TutorialApplication::~TutorialApplication()
  {
    g_ispc_scene = nullptr;
    ispc_scene = nullptr;
    device_cleanup();
    if (g_device) rtcReleaseDevice(g_device);
    alignedUSMFree(pixels);
    pixels = nullptr;

#if defined(EMBREE_SYCL_SUPPORT)
    delete device; device = nullptr;
    delete queue; queue = nullptr;
    delete context; context = nullptr;
#endif
    
    width = 0;
    height = 0;
    alignedFree(g_stats);
    g_stats = nullptr;

#if defined(EMBREE_SYCL_SUPPORT)
    
    if (features & FEATURE_SYCL)
      disableUSMAllocTutorial();

#endif
  }